

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * an(char *str)

{
  int iVar1;
  char *__dest;
  char *pcVar2;
  char *buf;
  char *str_local;
  
  __dest = nextobuf();
  *__dest = '\0';
  iVar1 = strncasecmp(str,"the ",4);
  if ((((iVar1 != 0) && (iVar1 = strcmp(str,"molten lava"), iVar1 != 0)) &&
      (iVar1 = strcmp(str,"iron bars"), iVar1 != 0)) &&
     ((iVar1 = strcmp(str,"muddy swamp"), iVar1 != 0 && (iVar1 = strcmp(str,"ice"), iVar1 != 0)))) {
    pcVar2 = strchr("aeiouAEIOU",(int)*str);
    if ((((pcVar2 == (char *)0x0) ||
         ((iVar1 = strncmp(str,"one-",4), iVar1 == 0 ||
          (iVar1 = strncmp(str,"useful",6), iVar1 == 0)))) ||
        (iVar1 = strncmp(str,"unicorn",7), iVar1 == 0)) ||
       ((iVar1 = strncmp(str,"uranium",7), iVar1 == 0 ||
        (iVar1 = strncmp(str,"eucalyptus",10), iVar1 == 0)))) {
      strcpy(__dest,"a ");
    }
    else {
      strcpy(__dest,"an ");
    }
  }
  strcat(__dest,str);
  return __dest;
}

Assistant:

char *an(const char *str)
{
	char *buf = nextobuf();

	buf[0] = '\0';

	if (strncmpi(str, "the ", 4) &&
	    strcmp(str, "molten lava") &&
	    strcmp(str, "iron bars") &&
	    strcmp(str, "muddy swamp") &&
	    strcmp(str, "ice")) {
		if (strchr(vowels, *str) &&
		    strncmp(str, "one-", 4) &&
		    strncmp(str, "useful", 6) &&
		    strncmp(str, "unicorn", 7) &&
		    strncmp(str, "uranium", 7) &&
		    strncmp(str, "eucalyptus", 10))
			strcpy(buf, "an ");
		else
			strcpy(buf, "a ");
	}

	strcat(buf, str);
	return buf;
}